

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::StructUnionTypeSyntax::StructUnionTypeSyntax
          (StructUnionTypeSyntax *this,SyntaxKind kind,Token keyword,Token taggedOrSoft,Token packed
          ,Token signing,Token openBrace,SyntaxList<slang::syntax::StructUnionMemberSyntax> *members
          ,Token closeBrace,SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions)

{
  size_t sVar1;
  pointer ppSVar2;
  pointer ppVVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  
  uVar6 = keyword._0_8_;
  uVar8 = taggedOrSoft._0_8_;
  (this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = kind;
  (this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (SyntaxNode *)0x0;
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->taggedOrSoft).kind = (short)uVar8;
  (this->taggedOrSoft).field_0x2 = (char)((ulong)uVar8 >> 0x10);
  (this->taggedOrSoft).numFlags = (NumericTokenFlags)(char)((ulong)uVar8 >> 0x18);
  (this->taggedOrSoft).rawLen = (int)((ulong)uVar8 >> 0x20);
  (this->taggedOrSoft).info = taggedOrSoft.info;
  (this->packed).kind = packed.kind;
  (this->packed).field_0x2 = packed._2_1_;
  (this->packed).numFlags = (NumericTokenFlags)packed.numFlags.raw;
  (this->packed).rawLen = packed.rawLen;
  (this->packed).info = packed.info;
  (this->signing).kind = signing.kind;
  (this->signing).field_0x2 = signing._2_1_;
  (this->signing).numFlags = (NumericTokenFlags)signing.numFlags.raw;
  (this->signing).rawLen = signing.rawLen;
  (this->signing).info = signing.info;
  (this->openBrace).kind = openBrace.kind;
  (this->openBrace).field_0x2 = openBrace._2_1_;
  (this->openBrace).numFlags = (NumericTokenFlags)openBrace.numFlags.raw;
  (this->openBrace).rawLen = openBrace.rawLen;
  (this->openBrace).info = openBrace.info;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (members->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (members->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar1 = (members->super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (this->members).super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>.
  _M_ptr = (members->super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>).
           _M_ptr;
  (this->members).super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a63c0;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  uVar5 = *(undefined4 *)&(dimensions->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (dimensions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (dimensions->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (dimensions->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006a4de0;
  (this->dimensions).super_SyntaxListBase.childCount = (dimensions->super_SyntaxListBase).childCount
  ;
  sVar1 = (dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_ptr = (dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
           )._M_ptr;
  (this->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar1;
  (this->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006a5008;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->members).
          super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppSVar2 = (this->members).
              super_span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      *(StructUnionTypeSyntax **)(*(long *)((long)ppSVar2 + lVar7) + 8) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  (this->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppVVar3 = (this->dimensions).
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar7 = 0;
    do {
      *(StructUnionTypeSyntax **)(*(long *)((long)ppVVar3 + lVar7) + 8) = this;
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  return;
}

Assistant:

StructUnionTypeSyntax(SyntaxKind kind, Token keyword, Token taggedOrSoft, Token packed, Token signing, Token openBrace, const SyntaxList<StructUnionMemberSyntax>& members, Token closeBrace, const SyntaxList<VariableDimensionSyntax>& dimensions) :
        DataTypeSyntax(kind), keyword(keyword), taggedOrSoft(taggedOrSoft), packed(packed), signing(signing), openBrace(openBrace), members(members), closeBrace(closeBrace), dimensions(dimensions) {
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        this->dimensions.parent = this;
        for (auto child : this->dimensions)
            child->parent = this;
    }